

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::sherwood_v3_table<$ed070bb7$>::clear(sherwood_v3_table<_ed070bb7_> *this)

{
  EntryPointer this_00;
  long lVar1;
  
  this_00 = this->entries;
  for (lVar1 = (long)this->max_lookups * 0x30 + this->num_slots_minus_one * 0x30; lVar1 != 0;
      lVar1 = lVar1 + -0x30) {
    if (-1 < this_00->distance_from_desired) {
      sherwood_v3_entry<std::pair<slang::DiagCode,_ska::flat_hash_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
      ::destroy_value(this_00);
    }
    this_00 = this_00 + 1;
  }
  this->num_elements = 0;
  return;
}

Assistant:

[[clang::reinitializes]]
    void clear()
    {
        for (EntryPointer it = entries, end = it + static_cast<ptrdiff_t>(num_slots_minus_one + max_lookups); it != end; ++it)
        {
            if (it->has_value())
                it->destroy_value();
        }
        num_elements = 0;
    }